

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O1

bool __thiscall ObjectFile::writeAttributes(ObjectFile *this,File *objectFile)

{
  char extraout_AL;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  unsigned_long uVar5;
  ByteString *value;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *value_00;
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  *value_01;
  _Rb_tree_node_base *p_Var6;
  __off_t __length;
  File *__file;
  char *format;
  pointer pcVar7;
  _Self __tmp;
  
  __file = objectFile;
  Generation::sync(this->gen);
  if (extraout_AL == '\0') {
    pcVar7 = (this->path)._M_dataplus._M_p;
    format = "Failed to synchronize generation number from object %s";
    iVar4 = 0x20e;
  }
  else {
    iVar4 = File::truncate(objectFile,(char *)__file,__length);
    if ((char)iVar4 != '\0') {
      Generation::update(this->gen);
      uVar5 = Generation::get(this->gen);
      bVar1 = File::writeULong(objectFile,uVar5);
      if (bVar1) {
        bVar1 = true;
        for (p_Var6 = (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(this->attributes)._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          if (p_Var6[1]._M_parent != (_Base_ptr)0x0) {
            bVar2 = File::writeULong(objectFile,*(unsigned_long *)(p_Var6 + 1));
            if (!bVar2) {
              pcVar7 = (this->path)._M_dataplus._M_p;
              format = "Failed to write PKCS #11 attribute type to object %s";
              iVar4 = 0x239;
              goto LAB_001349f8;
            }
            bVar2 = OSAttribute::isBooleanAttribute((OSAttribute *)p_Var6[1]._M_parent);
            if (bVar2) {
              bVar2 = OSAttribute::getBooleanValue((OSAttribute *)p_Var6[1]._M_parent);
              bVar3 = File::writeULong(objectFile,1);
              if ((!bVar3) || (bVar2 = File::writeBool(objectFile,bVar2), !bVar2)) {
                pcVar7 = (this->path)._M_dataplus._M_p;
                format = "Failed to write attribute to object %s";
                iVar4 = 0x247;
                goto LAB_001349f8;
              }
            }
            else {
              bVar2 = OSAttribute::isUnsignedLongAttribute((OSAttribute *)p_Var6[1]._M_parent);
              if (bVar2) {
                uVar5 = OSAttribute::getUnsignedLongValue((OSAttribute *)p_Var6[1]._M_parent);
                bVar2 = File::writeULong(objectFile,2);
                if ((!bVar2) || (bVar2 = File::writeULong(objectFile,uVar5), !bVar2)) {
                  pcVar7 = (this->path)._M_dataplus._M_p;
                  format = "Failed to write attribute to object %s";
                  iVar4 = 0x255;
                  goto LAB_001349f8;
                }
              }
              else {
                bVar2 = OSAttribute::isByteStringAttribute((OSAttribute *)p_Var6[1]._M_parent);
                if (bVar2) {
                  value = OSAttribute::getByteStringValue((OSAttribute *)p_Var6[1]._M_parent);
                  bVar2 = File::writeULong(objectFile,3);
                  if ((!bVar2) || (bVar2 = File::writeByteString(objectFile,value), !bVar2)) {
                    pcVar7 = (this->path)._M_dataplus._M_p;
                    format = "Failed to write attribute to object %s";
                    iVar4 = 0x263;
                    goto LAB_001349f8;
                  }
                }
                else {
                  bVar2 = OSAttribute::isMechanismTypeSetAttribute
                                    ((OSAttribute *)p_Var6[1]._M_parent);
                  if (bVar2) {
                    value_00 = OSAttribute::getMechanismTypeSetValue
                                         ((OSAttribute *)p_Var6[1]._M_parent);
                    bVar2 = File::writeULong(objectFile,5);
                    if ((!bVar2) ||
                       (bVar2 = File::writeMechanismTypeSet(objectFile,value_00), !bVar2)) {
                      pcVar7 = (this->path)._M_dataplus._M_p;
                      format = "Failed to write attribute to object %s";
                      iVar4 = 0x271;
                      goto LAB_001349f8;
                    }
                  }
                  else {
                    bVar2 = OSAttribute::isAttributeMapAttribute((OSAttribute *)p_Var6[1]._M_parent)
                    ;
                    if (!bVar2) {
                      pcVar7 = (this->path)._M_dataplus._M_p;
                      format = "Unknown attribute type for object %s";
                      iVar4 = 0x288;
                      goto LAB_001349f8;
                    }
                    value_01 = OSAttribute::getAttributeMapValue((OSAttribute *)p_Var6[1]._M_parent)
                    ;
                    bVar2 = File::writeULong(objectFile,4);
                    if ((!bVar2) || (bVar2 = File::writeAttributeMap(objectFile,value_01), !bVar2))
                    {
                      pcVar7 = (this->path)._M_dataplus._M_p;
                      format = "Failed to write attribute to object %s";
                      iVar4 = 0x27f;
                      goto LAB_001349f8;
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        bVar1 = false;
        softHSMLog(7,"writeAttributes",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x224,"Failed to write new generation number to object %s",
                   (this->path)._M_dataplus._M_p);
        Generation::rollback(this->gen);
      }
      goto LAB_001349ff;
    }
    pcVar7 = (this->path)._M_dataplus._M_p;
    format = "Failed to reset object %s";
    iVar4 = 0x217;
  }
LAB_001349f8:
  bVar1 = false;
  softHSMLog(7,"writeAttributes",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
             ,iVar4,format,pcVar7);
LAB_001349ff:
  File::unlock(objectFile);
  return bVar1;
}

Assistant:

bool ObjectFile::writeAttributes(File &objectFile)
{
	if (!gen->sync(objectFile))
	{
		DEBUG_MSG("Failed to synchronize generation number from object %s", path.c_str());

		objectFile.unlock();

		return false;
	}

	if (!objectFile.truncate())
	{
		DEBUG_MSG("Failed to reset object %s", path.c_str());

		objectFile.unlock();

		return false;
	}

	gen->update();

	unsigned long newGen = gen->get();

	if (!objectFile.writeULong(newGen))
	{
		DEBUG_MSG("Failed to write new generation number to object %s", path.c_str());

		gen->rollback();

		objectFile.unlock();

		return false;
	}


	for (std::map<CK_ATTRIBUTE_TYPE, OSAttribute*>::iterator i = attributes.begin(); i != attributes.end(); i++)
	{
		if (i->second == NULL)
		{
			continue;
		}

		unsigned long p11AttrType = i->first;

		if (!objectFile.writeULong(p11AttrType))
		{
			DEBUG_MSG("Failed to write PKCS #11 attribute type to object %s", path.c_str());

			objectFile.unlock();

			return false;
		}

		if (i->second->isBooleanAttribute())
		{
			unsigned long osAttrType = BOOLEAN_ATTR;
			bool value = i->second->getBooleanValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeBool(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else if (i->second->isUnsignedLongAttribute())
		{
			unsigned long osAttrType = ULONG_ATTR;
			unsigned long value = i->second->getUnsignedLongValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeULong(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else if (i->second->isByteStringAttribute())
		{
			unsigned long osAttrType = BYTESTR_ATTR;
			const ByteString& value = i->second->getByteStringValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeByteString(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else if (i->second->isMechanismTypeSetAttribute())
		{
			unsigned long osAttrType = MECHSET_ATTR;
			const std::set<CK_MECHANISM_TYPE>& value = i->second->getMechanismTypeSetValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeMechanismTypeSet(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else if (i->second->isAttributeMapAttribute())
		{
			unsigned long osAttrType = ATTRMAP_ATTR;
			const std::map<CK_ATTRIBUTE_TYPE,OSAttribute>& value = i->second->getAttributeMapValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeAttributeMap(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else
		{
			DEBUG_MSG("Unknown attribute type for object %s", path.c_str());

			objectFile.unlock();

			return false;
		}
	}

	objectFile.unlock();

	return true;
}